

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatBase.h
# Opt level: O1

TPZBndCondT<double> *
TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::CreateBCImpl<>
          (TPZMaterial *reference,int id,int type,TPZFMatrix<double> *val1,TPZVec<double> *val2)

{
  TPZBndCondBase<double,_TPZMatSingleSpaceBC<double>,_TPZMatInterfaceSingleSpaceBC<double>_> *this;
  
  this = (TPZBndCondBase<double,_TPZMatSingleSpaceBC<double>,_TPZMatInterfaceSingleSpaceBC<double>_>
          *)operator_new(0x1b0);
  TPZBndCondBase<double,_TPZMatSingleSpaceBC<double>,_TPZMatInterfaceSingleSpaceBC<double>_>::
  TPZBndCondBase(this,reference,id,type,val1,val2);
  return &this->super_TPZBndCondT<double>;
}

Assistant:

TPZBndCondT<TVar> *
TPZMatBase<TVar, Interfaces...>::CreateBCImpl(TPZMaterial *reference, int id, int type, const TPZFMatrix<TVar> &val1,
                                              const TPZVec<TVar> &val2) {
    return new TPZBndCondBase<TVar, typename Interfaces::TInterfaceBC...,
            typename AddInterfaces::TInterfaceBC...>(reference, id, type, val1, val2);
}